

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImNodes.cpp
# Opt level: O2

bool ImNodes::IsSlotCurveHovered(void)

{
  ImGuiStorage *this;
  bool bVar1;
  int iVar2;
  ImU32 key;
  int slot_kind;
  char *slot_title;
  void *node_id;
  int local_1c;
  char *local_18;
  void *local_10;
  
  if (gCanvas == 0) {
    __assert_fail("gCanvas != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/ImNodes/ImNodes.cpp"
                  ,0x31a,"bool ImNodes::IsSlotCurveHovered()");
  }
  this = *(ImGuiStorage **)(gCanvas + 0x98);
  bVar1 = GetPendingConnection(&local_10,&local_18,&local_1c);
  if (bVar1) {
    if ((local_10 == *(void **)&this[1].Data) &&
       (iVar2 = strcmp(local_18,*(char **)&this[3].Data), iVar2 == 0)) {
      return local_1c == *(int *)&this[2].Data.Data;
    }
    bVar1 = false;
  }
  else {
    key = MakeSlotDataID("hovered",*(char **)&this[3].Data,*(void **)&this[1].Data,
                         SUB41((uint)*(undefined4 *)&this[2].Data.Data >> 0x1f,0));
    bVar1 = ImGuiStorage::GetBool(this,key,false);
  }
  return bVar1;
}

Assistant:

bool IsSlotCurveHovered()
{
    assert(gCanvas != nullptr);
    auto* canvas = gCanvas;
    auto* impl = canvas->_impl;

    void* node_id;
    const char* slot_title;
    int slot_kind;
    if (ImNodes::GetPendingConnection(&node_id, &slot_title, &slot_kind))
    {
        // In-progress connection to current slot is hovered
        return node_id == impl->node.id && strcmp(slot_title, impl->slot.title) == 0 &&
               slot_kind == impl->slot.kind;
    }

    // Actual curve is hovered
    return impl->cached_data.GetBool(MakeSlotDataID("hovered", impl->slot.title, impl->node.id,
           IsInputSlotKind(impl->slot.kind)));
}